

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql_statement.hpp
# Opt level: O1

PragmaStatement * __thiscall duckdb::SQLStatement::Cast<duckdb::PragmaStatement>(SQLStatement *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->type == PRAGMA_STATEMENT) {
    return (PragmaStatement *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Failed to cast statement to type - statement type mismatch","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET &Cast() {
		if (type != TARGET::TYPE && TARGET::TYPE != StatementType::INVALID_STATEMENT) {
			throw InternalException("Failed to cast statement to type - statement type mismatch");
		}
		return reinterpret_cast<TARGET &>(*this);
	}